

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O3

string * __thiscall
cmFindPathCommand::FindHeaderInFramework
          (string *__return_storage_ptr__,cmFindPathCommand *this,string *file,string *dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GlobInternals *pGVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  pointer pcVar5;
  bool bVar6;
  long lVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string glob;
  string frameWorkName;
  string fileName;
  Glob globIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_100;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  long *local_c0 [2];
  long local_b0 [2];
  undefined1 local_a0 [17];
  undefined7 uStack_8f;
  size_type sStack_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_c0[0] = local_b0;
  pcVar5 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar5,pcVar5 + file->_M_string_length);
  local_e0 = &local_d0;
  local_d8 = 0;
  local_d0 = 0;
  lVar7 = std::__cxx11::string::find((char)(string *)local_c0,0x2f);
  if (lVar7 != -1) {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_c0);
    std::__cxx11::string::operator=((string *)local_c0,(string *)local_a0);
    pGVar2 = (GlobInternals *)(local_a0 + 0x10);
    if ((GlobInternals *)local_a0._0_8_ != pGVar2) {
      operator_delete((void *)local_a0._0_8_,CONCAT71(uStack_8f,local_a0[0x10]) + 1);
    }
    std::__cxx11::string::_M_assign((string *)&local_e0);
    std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_e0);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)local_a0);
    if ((GlobInternals *)local_a0._0_8_ != pGVar2) {
      operator_delete((void *)local_a0._0_8_,CONCAT71(uStack_8f,local_a0[0x10]) + 1);
    }
    lVar7 = std::__cxx11::string::find((char)&local_e0,0x2f);
    if (lVar7 != -1) {
      std::__cxx11::string::_M_assign((string *)local_c0);
      local_d8 = 0;
      *local_e0 = 0;
    }
    if (local_d8 != 0) {
      pcVar5 = (dir->_M_dataplus)._M_p;
      local_a0._0_8_ = pGVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,pcVar5,pcVar5 + dir->_M_string_length);
      std::__cxx11::string::_M_append(local_a0,(ulong)local_e0);
      std::__cxx11::string::append(local_a0);
      paVar3 = &local_100.field_2;
      local_100._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,local_a0._0_8_,
                 (pointer)((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_a0._0_8_)->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + local_a0._8_8_));
      std::__cxx11::string::append((char *)&local_100);
      std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_c0[0]);
      bVar6 = cmsys::SystemTools::FileExists(&local_100);
      if (bVar6) {
        cVar4 = (this->super_cmFindBase).field_0x222;
        paVar1 = &__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
        if (cVar4 == '\x01') {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p == paVar3) {
            paVar1->_M_allocated_capacity = local_100.field_2._M_allocated_capacity;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_100.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = local_100._M_dataplus._M_p;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 local_100.field_2._M_allocated_capacity;
          }
          __return_storage_ptr__->_M_string_length = local_100._M_string_length;
        }
        else {
          if ((GlobInternals *)local_a0._0_8_ == pGVar2) {
            paVar1->_M_allocated_capacity = CONCAT71(uStack_8f,local_a0[0x10]);
            *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) = sStack_88;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a0._0_8_;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(uStack_8f,local_a0[0x10]);
          }
          __return_storage_ptr__->_M_string_length = local_a0._8_8_;
          local_a0._8_8_ = 0;
          local_a0[0x10] = 0;
          local_a0._0_8_ = pGVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != paVar3) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
        }
        if ((GlobInternals *)local_a0._0_8_ != pGVar2) {
          operator_delete((void *)local_a0._0_8_,CONCAT71(uStack_8f,local_a0[0x10]) + 1);
        }
        goto LAB_00257f58;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar3) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((GlobInternals *)local_a0._0_8_ != pGVar2) {
        operator_delete((void *)local_a0._0_8_,CONCAT71(uStack_8f,local_a0[0x10]) + 1);
      }
    }
  }
  pcVar5 = (dir->_M_dataplus)._M_p;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar5,pcVar5 + dir->_M_string_length);
  std::__cxx11::string::append((char *)&local_100);
  std::__cxx11::string::_M_append((char *)&local_100,(ulong)(file->_M_dataplus)._M_p);
  cmsys::Glob::Glob((Glob *)local_a0);
  cmsys::Glob::FindFiles((Glob *)local_a0,&local_100,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__x);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    cmsys::SystemTools::CollapseFullPath
              (__return_storage_ptr__,
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if ((this->super_cmFindBase).field_0x222 == '\0') {
      std::__cxx11::string::resize
                ((ulong)__return_storage_ptr__,
                 (char)__return_storage_ptr__->_M_string_length - (char)file->_M_string_length);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  cmsys::Glob::~Glob((Glob *)local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
LAB_00257f58:
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeaderInFramework(std::string const& file,
                                                     std::string const& dir)
{
  std::string fileName = file;
  std::string frameWorkName;
  std::string::size_type pos = fileName.find('/');
  // if there is a / in the name try to find the header as a framework
  // For example bar/foo.h would look for:
  // bar.framework/Headers/foo.h
  if (pos != std::string::npos) {
    // remove the name from the slash;
    fileName = fileName.substr(pos + 1);
    frameWorkName = file;
    frameWorkName =
      frameWorkName.substr(0, frameWorkName.size() - fileName.size() - 1);
    // if the framework has a path in it then just use the filename
    if (frameWorkName.find('/') != std::string::npos) {
      fileName = file;
      frameWorkName.clear();
    }
    if (!frameWorkName.empty()) {
      std::string fpath = dir;
      fpath += frameWorkName;
      fpath += ".framework";
      std::string intPath = fpath;
      intPath += "/Headers/";
      intPath += fileName;
      if (cmSystemTools::FileExists(intPath)) {
        if (this->IncludeFileInPath) {
          return intPath;
        }
        return fpath;
      }
    }
  }
  // if it is not found yet or not a framework header, then do a glob search
  // for all frameworks in the directory: dir/*.framework/Headers/<file>
  std::string glob = dir;
  glob += "*.framework/Headers/";
  glob += file;
  cmsys::Glob globIt;
  globIt.FindFiles(glob);
  std::vector<std::string> files = globIt.GetFiles();
  if (!files.empty()) {
    std::string fheader = cmSystemTools::CollapseFullPath(files[0]);
    if (this->IncludeFileInPath) {
      return fheader;
    }
    fheader.resize(fheader.size() - file.size());
    return fheader;
  }
  return "";
}